

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O2

void __thiscall
bidirectional::BiDirectional::BiDirectional
          (BiDirectional *this,int *number_vertices,int *number_edges,int *source_id,int *sink_id,
          vector<double,_std::allocator<double>_> *max_res_in,
          vector<double,_std::allocator<double>_> *min_res_in)

{
  double dVar1;
  logger *this_00;
  allocator<char> local_71;
  undefined4 local_70;
  undefined4 uStack_6c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_> *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  string local_50;
  
  std::vector<double,_std::allocator<double>_>::vector(&this->max_res,max_res_in);
  local_58 = &this->min_res;
  std::vector<double,_std::allocator<double>_>::vector(local_58,min_res_in);
  local_60 = &this->params_ptr_;
  std::make_unique<bidirectional::Params>();
  std::make_unique<bidirectional::DiGraph,int_const&,int_const&,int_const&,int_const&>
            ((int *)&this->graph_ptr_,number_vertices,number_edges,source_id);
  (this->start_time_).__d.__r = 0;
  dVar1 = nan("nan");
  this->primal_st_bound_ = dVar1;
  this->iteration_ = 0;
  this->terminated_early_w_st_path_ = false;
  (this->max_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->max_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->max_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->min_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->min_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->min_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->best_label_).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->best_label_).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70 = 0;
  std::make_unique<bidirectional::Search,bidirectional::Directions>
            ((Directions *)&this->fwd_search_ptr_);
  local_70 = 1;
  std::make_unique<bidirectional::Search,bidirectional::Directions>
            ((Directions *)&this->bwd_search_ptr_);
  spdlog::default_logger();
  this_00 = (logger *)CONCAT44(uStack_6c,local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"%v",&local_71);
  spdlog::logger::set_pattern(this_00,&local_50,local);
  std::__cxx11::string::~string((string *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  return;
}

Assistant:

BiDirectional::BiDirectional(
    const int&                 number_vertices,
    const int&                 number_edges,
    const int&                 source_id,
    const int&                 sink_id,
    const std::vector<double>& max_res_in,
    const std::vector<double>& min_res_in)
    : max_res(max_res_in),
      min_res(min_res_in),
      // Private pointer initialisations
      params_ptr_(std::make_unique<bidirectional::Params>()),
      graph_ptr_(std::make_unique<DiGraph>(
          number_vertices,
          number_edges,
          source_id,
          sink_id)),
      fwd_search_ptr_(std::make_unique<bidirectional::Search>(FWD)),
      bwd_search_ptr_(std::make_unique<bidirectional::Search>(BWD)) {
#if SPDLOG_ACTIVE_LEVEL == SPDLOG_LEVEL_DEBUG
  // Needed as not printed otherwise
  spdlog::set_level(spdlog::level::debug);
#endif
  spdlog::default_logger()->set_pattern("%v");
  SPDLOG_INFO(
      "************************************************************************"
      "********");
  // spdlog::set_pattern("%+"); // back to default format
}